

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

void duckdb::FirstFunction<false,false>::
     Operation<duckdb::interval_t,duckdb::FirstState<duckdb::interval_t>,duckdb::FirstFunction<false,false>>
               (FirstState<duckdb::interval_t> *state,interval_t *input,
               AggregateUnaryInput *unary_input)

{
  int64_t iVar1;
  int32_t iVar2;
  bool bVar3;
  
  if (state->is_set == false) {
    bVar3 = AggregateUnaryInput::RowIsValid(unary_input);
    state->is_set = true;
    if (bVar3) {
      state->is_null = false;
      iVar2 = input->days;
      iVar1 = input->micros;
      (state->value).months = input->months;
      (state->value).days = iVar2;
      (state->value).micros = iVar1;
    }
    else {
      state->is_null = true;
    }
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		if (LAST || !state.is_set) {
			if (!unary_input.RowIsValid()) {
				if (!SKIP_NULLS) {
					state.is_set = true;
				}
				state.is_null = true;
			} else {
				state.is_set = true;
				state.is_null = false;
				state.value = input;
			}
		}
	}